

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combine_access_chains.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::CombineAccessChains::Has64BitIndices(CombineAccessChains *this,Instruction *inst)

{
  IRContext *pIVar1;
  DefUseManager *this_00;
  TypeManager *this_01;
  byte bVar2;
  uint32_t uVar3;
  int iVar4;
  Instruction *this_02;
  Type *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  
  bVar2 = inst->has_type_id_;
  bVar6 = inst->has_result_id_;
  uVar8 = (bVar6 & 1) + 1;
  if ((bool)bVar2 == false) {
    uVar8 = (uint)bVar6;
  }
  if (1 < (int)((ulong)((long)(inst->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(inst->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar8)
  {
    uVar8 = 1;
    do {
      pIVar1 = (this->super_Pass).context_;
      if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar1);
        bVar2 = inst->has_type_id_;
        bVar6 = inst->has_result_id_;
      }
      this_00 = (pIVar1->def_use_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl
      ;
      uVar7 = (bVar6 & 1) + 1;
      if ((bVar2 & 1) == 0) {
        uVar7 = (uint)bVar6;
      }
      uVar3 = Instruction::GetSingleWordOperand(inst,uVar7 + uVar8);
      this_02 = analysis::DefUseManager::GetDef(this_00,uVar3);
      pIVar1 = (this->super_Pass).context_;
      if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
        IRContext::BuildTypeManager(pIVar1);
      }
      this_01 = (pIVar1->type_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
      uVar3 = 0;
      if (this_02->has_type_id_ == true) {
        uVar3 = Instruction::GetSingleWordOperand(this_02,0);
      }
      pTVar5 = analysis::TypeManager::GetType(this_01,uVar3);
      iVar4 = (*pTVar5->_vptr_Type[10])(pTVar5);
      if (CONCAT44(extraout_var,iVar4) == 0) {
        return true;
      }
      iVar4 = (*pTVar5->_vptr_Type[10])(pTVar5);
      if (*(int *)(CONCAT44(extraout_var_00,iVar4) + 0x24) != 0x20) {
        return true;
      }
      uVar8 = uVar8 + 1;
      bVar2 = inst->has_type_id_;
      bVar6 = inst->has_result_id_;
      uVar7 = (bVar6 & 1) + 1;
      if ((bool)bVar2 == false) {
        uVar7 = (uint)bVar6;
      }
    } while (uVar8 < (int)((ulong)((long)(inst->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(inst->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555 - uVar7);
  }
  return false;
}

Assistant:

bool CombineAccessChains::Has64BitIndices(Instruction* inst) {
  for (uint32_t i = 1; i < inst->NumInOperands(); ++i) {
    Instruction* index_inst =
        context()->get_def_use_mgr()->GetDef(inst->GetSingleWordInOperand(i));
    const analysis::Type* index_type =
        context()->get_type_mgr()->GetType(index_inst->type_id());
    if (!index_type->AsInteger() || index_type->AsInteger()->width() != 32)
      return true;
  }
  return false;
}